

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_SetPointerPluginTest_installTwoFunctionPointer_TestShell::
~TEST_SetPointerPluginTest_installTwoFunctionPointer_TestShell
          (TEST_SetPointerPluginTest_installTwoFunctionPointer_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SetPointerPluginTest, installTwoFunctionPointer)
{
    FunctionPointerUtestShell *tst = new FunctionPointerUtestShell();

    fp1 = orig_func1;
    fp2 = orig_func2;
    myRegistry_->addTest(tst);
    myRegistry_->runAllTests(*result_);
    CHECK(fp1 == orig_func1);
    CHECK(fp2 == orig_func2);
    LONGS_EQUAL(0, result_->getFailureCount());
    LONGS_EQUAL(2, result_->getCheckCount());
    delete tst;
}